

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<GraphContigger> * __thiscall
pybind11::class_<GraphContigger>::
def<void(GraphContigger::*)(GraphEditor&,PairedReadsDatastore&,int,bool),pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v>
          (class_<GraphContigger> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          arg *extra_1,arg_v *extra_2,arg_v *extra_3)

{
  handle obj;
  object *in_RCX;
  undefined8 *in_RDX;
  PyObject *extraout_RDX;
  sibling *in_RSI;
  handle *in_RDI;
  char *in_R8;
  cpp_function *in_R9;
  cpp_function cf;
  handle *in_stack_ffffffffffffff18;
  sibling *in_stack_ffffffffffffff20;
  none *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  handle default_;
  offset_in_Node_to_subr in_stack_ffffffffffffff70;
  cpp_function *in_stack_ffffffffffffff80;
  arg *in_stack_ffffffffffffffa0;
  is_method in_stack_ffffffffffffffa8;
  name in_stack_ffffffffffffffb0;
  arg_v *extra_6;
  
  extra_6 = (arg_v *)*in_RDX;
  obj.m_ptr = (PyObject *)
              _GraphContigger___pybind11__method_adaptor<GraphContigger,void,GraphContigger,GraphEditor&,PairedReadsDatastore&,int,bool>_void_GraphContigger_____GraphEditor__PairedReadsDatastore__int_bool___
                        (extra_6,in_RDX[1]);
  default_.m_ptr = extraout_RDX;
  pybind11::name::name((name *)&stack0xffffffffffffffb0,(char *)in_RSI);
  is_method::is_method((is_method *)&stack0xffffffffffffffa8,in_RDI);
  none::none(in_stack_ffffffffffffff30);
  getattr(obj,in_stack_ffffffffffffff38,default_);
  sibling::sibling(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  cpp_function::
  cpp_function<void,GraphContigger,GraphEditor&,PairedReadsDatastore&,int,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,(name *)default_.m_ptr,
             (is_method *)obj.m_ptr,in_RSI,in_stack_ffffffffffffffa0,
             (arg *)in_stack_ffffffffffffffa8.class_.m_ptr,(arg_v *)in_stack_ffffffffffffffb0.value,
             extra_6);
  object::~object((object *)0x287428);
  none::~none((none *)0x287432);
  pybind11::detail::add_class_method(in_RCX,in_R8,in_R9);
  cpp_function::~cpp_function((cpp_function *)0x28745b);
  return (class_<GraphContigger> *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }